

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR xpath_substring(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  unkuint10 Var1;
  ly_ctx *plVar2;
  ly_bool lVar3;
  LY_ERR LVar4;
  uint uVar5;
  lysc_node *plVar6;
  char *pcVar7;
  ushort uStack_90;
  short sStack_70;
  ushort uStack_60;
  LY_ERR ret___1;
  LY_ERR ret__;
  LY_ERR rc;
  lysc_node_leaf *sleaf;
  uint32_t pos;
  uint32_t str_len;
  uint32_t str_start;
  int32_t len;
  int64_t start;
  uint32_t options_local;
  lyxp_set *set_local;
  uint32_t arg_count_local;
  lyxp_set **args_local;
  
  if ((options & 0x1c) == 0) {
    args_local._4_4_ = lyxp_set_cast(*args,LYXP_SET_STRING);
    if (args_local._4_4_ == LY_SUCCESS) {
      LVar4 = xpath_round(args + 1,1,args[1],options);
      if (LVar4 == LY_SUCCESS) {
        Var1 = *(unkuint10 *)&args[1]->val;
        uStack_60 = (ushort)(Var1 >> 0x40);
        if ((Var1 & 0x7fff) == 0 ||
            ((ushort)((uStack_60 & 0x7fff) - 1) < 0x7ffe & (byte)(Var1 >> 0x38) >> 7) != 0) {
          _str_start = (long)ROUND(-(longdouble)1 + (args[1]->val).num);
        }
        else {
          sStack_70 = (short)((unkuint10)(args[1]->val).num >> 0x40);
          uVar5 = 0;
          if ((longdouble)INFINITY <= ABS((args[1]->val).num)) {
            uVar5 = (uint)((ulong)(long)sStack_70 >> 0xf) | 1;
          }
          if ((uVar5 == 0) || (-1 < *(short *)((long)&args[1]->val + 8))) {
            _str_start = 0x7fffffff;
          }
          else {
            _str_start = -0x80000000;
          }
        }
        if (arg_count == 3) {
          LVar4 = xpath_round(args + 2,1,args[2],options);
          if (LVar4 != LY_SUCCESS) {
            return LVar4;
          }
          if ((NAN((args[2]->val).num)) || (*(short *)((long)&args[2]->val + 8) < 0)) {
            str_len = 0;
          }
          else {
            Var1 = *(unkuint10 *)&args[2]->val;
            uStack_90 = (ushort)(Var1 >> 0x40);
            if ((Var1 & 0x7fff) == 0 ||
                ((ushort)((uStack_90 & 0x7fff) - 1) < 0x7ffe & (byte)(Var1 >> 0x38) >> 7) != 0) {
              str_len = (uint32_t)ROUND((args[2]->val).num);
            }
            else {
              str_len = 0x7fffffff;
            }
          }
        }
        else {
          str_len = 0x7fffffff;
        }
        pos = 0;
        sleaf._4_4_ = 0;
        for (sleaf._0_4_ = 0;
            *(char *)((long)&(((*args)->val).nodes)->node + (ulong)(uint)sleaf) != '\0';
            sleaf._0_4_ = (uint)sleaf + 1) {
          if ((long)(ulong)(uint)sleaf < _str_start) {
            pos = pos + 1;
          }
          else {
            if (_str_start + (int)str_len <= (long)(ulong)(uint)sleaf) break;
            sleaf._4_4_ = sleaf._4_4_ + 1;
          }
        }
        set_fill_string(set,(char *)((long)&(((*args)->val).nodes)->node + (ulong)pos),sleaf._4_4_);
        args_local._4_4_ = LY_SUCCESS;
      }
      else {
        args_local._4_4_ = ~LY_SUCCESS;
      }
    }
  }
  else {
    if (((*args)->type == LYXP_SET_SCNODE_SET) &&
       (plVar6 = warn_get_scnode_in_ctx(*args), plVar6 != (lysc_node *)0x0)) {
      if ((plVar6->nodetype & 0xc) == 0) {
        plVar2 = set->ctx;
        pcVar7 = lys_nodetype2str(plVar6->nodetype);
        ly_log(plVar2,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s is a %s node \"%s\".","xpath_substring"
               ,pcVar7,plVar6->name);
      }
      else {
        lVar3 = warn_is_string_type((lysc_type *)plVar6[1].parent);
        if (lVar3 == '\0') {
          ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #1 of %s is node \"%s\", not of string-type.","xpath_substring",
                 plVar6->name);
        }
      }
    }
    if ((args[1]->type == LYXP_SET_SCNODE_SET) &&
       (plVar6 = warn_get_scnode_in_ctx(args[1]), plVar6 != (lysc_node *)0x0)) {
      if ((plVar6->nodetype & 0xc) == 0) {
        plVar2 = set->ctx;
        pcVar7 = lys_nodetype2str(plVar6->nodetype);
        ly_log(plVar2,LY_LLWRN,LY_SUCCESS,"Argument #2 of %s is a %s node \"%s\".","xpath_substring"
               ,pcVar7,plVar6->name);
      }
      else {
        lVar3 = warn_is_numeric_type((lysc_type *)plVar6[1].parent);
        if (lVar3 == '\0') {
          ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #2 of %s is node \"%s\", not of numeric type.","xpath_substring",
                 plVar6->name);
        }
      }
    }
    if (((arg_count == 3) && (args[2]->type == LYXP_SET_SCNODE_SET)) &&
       (plVar6 = warn_get_scnode_in_ctx(args[2]), plVar6 != (lysc_node *)0x0)) {
      if ((plVar6->nodetype & 0xc) == 0) {
        plVar2 = set->ctx;
        pcVar7 = lys_nodetype2str(plVar6->nodetype);
        ly_log(plVar2,LY_LLWRN,LY_SUCCESS,"Argument #3 of %s is a %s node \"%s\".","xpath_substring"
               ,pcVar7,plVar6->name);
      }
      else {
        lVar3 = warn_is_numeric_type((lysc_type *)plVar6[1].parent);
        if (lVar3 == '\0') {
          ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #3 of %s is node \"%s\", not of numeric type.","xpath_substring",
                 plVar6->name);
        }
      }
    }
    set_scnode_clear_ctx(set,1);
    args_local._4_4_ = LY_SUCCESS;
  }
  return args_local._4_4_;
}

Assistant:

static LY_ERR
xpath_substring(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    int64_t start;
    int32_t len;
    uint32_t str_start, str_len, pos;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }

        if ((args[1]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_numeric_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #2 of %s is node \"%s\", not of numeric type.", __func__, sleaf->name);
            }
        }

        if ((arg_count == 3) && (args[2]->type == LYXP_SET_SCNODE_SET) &&
                (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[2]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #3 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_numeric_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #3 of %s is node \"%s\", not of numeric type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    /* start */
    if (xpath_round(&args[1], 1, args[1], options)) {
        return -1;
    }
    if (isfinite(args[1]->val.num)) {
        start = args[1]->val.num - 1;
    } else if (isinf(args[1]->val.num) && signbit(args[1]->val.num)) {
        start = INT32_MIN;
    } else {
        start = INT32_MAX;
    }

    /* len */
    if (arg_count == 3) {
        rc = xpath_round(&args[2], 1, args[2], options);
        LY_CHECK_RET(rc);
        if (isnan(args[2]->val.num) || signbit(args[2]->val.num)) {
            len = 0;
        } else if (isfinite(args[2]->val.num)) {
            len = args[2]->val.num;
        } else {
            len = INT32_MAX;
        }
    } else {
        len = INT32_MAX;
    }

    /* find matching character positions */
    str_start = 0;
    str_len = 0;
    for (pos = 0; args[0]->val.str[pos]; ++pos) {
        if (pos < start) {
            ++str_start;
        } else if (pos < start + len) {
            ++str_len;
        } else {
            break;
        }
    }

    set_fill_string(set, args[0]->val.str + str_start, str_len);
    return LY_SUCCESS;
}